

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_counted_base_gcc_atomic.hpp
# Opt level: O2

uint_least32_t boost::detail::atomic_conditional_increment(uint_least32_t *pw)

{
  uint_least32_t uVar1;
  uint_least32_t uVar2;
  bool bVar3;
  
  uVar2 = *pw;
  do {
    uVar1 = uVar2;
    if (uVar1 == 0) {
      return 0;
    }
    LOCK();
    uVar2 = *pw;
    bVar3 = uVar1 == uVar2;
    if (bVar3) {
      *pw = uVar1 + 1;
      uVar2 = uVar1;
    }
    UNLOCK();
  } while (!bVar3);
  return uVar1;
}

Assistant:

inline boost::uint_least32_t atomic_conditional_increment( boost::uint_least32_t * pw )
{
    // long r = *pw;
    // if( r != 0 ) ++*pw;
    // return r;

    boost::uint_least32_t r = __atomic_load_n( pw, __ATOMIC_RELAXED );

    for( ;; )
    {
        if( r == 0 )
        {
            return r;
        }

        if( __atomic_compare_exchange_n( pw, &r, r + 1, true, __ATOMIC_RELAXED, __ATOMIC_RELAXED ) )
        {
            return r;
        }
    }
}